

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool __thiscall ON_BinaryArchive::ReadArray(ON_BinaryArchive *this,ON_ClassArray<ON_String> *a)

{
  bool bVar1;
  bool bVar2;
  ON_String *s;
  int iVar3;
  int count;
  uint local_1c;
  
  ON_ClassArray<ON_String>::Empty(a);
  local_1c = 0;
  bVar2 = ReadInt32(this,1,(ON__INT32 *)&local_1c);
  if (0 < (int)local_1c && bVar2) {
    ON_ClassArray<ON_String>::SetCapacity(a,(ulong)local_1c);
    if ((int)local_1c < 1) {
      bVar2 = true;
    }
    else {
      iVar3 = 1;
      do {
        s = ON_ClassArray<ON_String>::AppendNew(a);
        bVar2 = ReadString(this,s);
        if (!bVar2) {
          return bVar2;
        }
        bVar1 = iVar3 < (int)local_1c;
        iVar3 = iVar3 + 1;
      } while (bVar1);
    }
  }
  return bVar2;
}

Assistant:

bool 
ON_BinaryArchive::ReadArray( ON_ClassArray<ON_String>& a)
{
  a.Empty();
  int count = 0;
  bool rc = ReadInt( &count );
  if ( rc && count > 0 ) 
  {
    a.SetCapacity( count );
    int i;
    for ( i = 0; i < count && rc; i++ )
    {
      rc = ReadString( a.AppendNew() );
    }
  }
  return rc;
}